

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_factorization.cc
# Opt level: O3

void __thiscall
ipx::LuFactorization::Factorize
          (LuFactorization *this,Int dim,Int *Bbegin,Int *Bend,Int *Bi,double *Bx,double pivottol,
          bool strict_abs_pivottol,SparseMatrix *L,SparseMatrix *U,
          vector<int,_std::allocator<int>_> *rowperm,vector<int,_std::allocator<int>_> *colperm,
          vector<int,_std::allocator<int>_> *dependent_cols)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  int *piVar4;
  pointer pdVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double *pdVar9;
  size_t sVar10;
  double *pdVar11;
  int iVar12;
  ulong uVar13;
  int *piVar14;
  long lVar15;
  int iVar16;
  uint nrow;
  undefined4 uVar17;
  undefined4 uVar18;
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar23;
  allocator_type local_18a;
  bool local_189;
  Vector lhs;
  Vector rhs;
  undefined8 local_168;
  vector<int,_std::allocator<int>_> permuted_row;
  vector<bool,_std::allocator<bool>_> local_d8;
  SparseMatrix local_b0;
  
  (*this->_vptr_LuFactorization[2])(SUB84(pivottol,0));
  uVar13 = (long)(rowperm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(rowperm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  iVar12 = (int)(uVar13 >> 2);
  uVar13 = (long)(uVar13 * 0x40000000) >> 0x1d;
  rhs._M_size = (long)iVar12;
  rhs._M_data = (double *)operator_new(uVar13);
  memset(rhs._M_data,0,uVar13);
  lhs._M_size = (long)iVar12;
  lhs._M_data = (double *)operator_new(uVar13);
  memset(lhs._M_data,0,uVar13);
  piVar2 = (rowperm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar3 = (rowperm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  InversePerm(&permuted_row,rowperm);
  nrow = (uint)((ulong)((long)piVar2 - (long)piVar3) >> 2);
  local_189 = false;
  std::vector<bool,_std::allocator<bool>_>::vector(&local_d8,(long)(int)nrow,&local_189,&local_18a);
  piVar4 = (dependent_cols->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (piVar14 = (dependent_cols->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start; piVar14 != piVar4; piVar14 = piVar14 + 1) {
    iVar1 = *piVar14;
    iVar16 = iVar1 + 0x3f;
    if (-1 < (long)iVar1) {
      iVar16 = iVar1;
    }
    local_d8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p
    [(long)(iVar16 >> 6) + ((ulong)(((long)iVar1 & 0x800000000000003fU) < 0x8000000000000001) - 1)]
         = local_d8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [(long)(iVar16 >> 6) +
            ((ulong)(((long)iVar1 & 0x800000000000003fU) < 0x8000000000000001) - 1)] |
           1L << ((byte)iVar1 & 0x3f);
  }
  SparseMatrix::SparseMatrix(&local_b0,nrow,0);
  if (0 < (int)nrow) {
    uVar13 = 0;
    do {
      if ((local_d8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[uVar13 >> 6 & 0x3ffffff] >> (uVar13 & 0x3f) & 1)
          == 0) {
        iVar1 = (colperm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar13];
        lVar15 = (long)Bbegin[iVar1];
        if (Bbegin[iVar1] < Bend[iVar1]) {
          do {
            SparseMatrix::push_back
                      (&local_b0,
                       permuted_row.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[Bi[lVar15]],Bx[lVar15]);
            lVar15 = lVar15 + 1;
          } while (lVar15 < Bend[iVar1]);
        }
      }
      else {
        SparseMatrix::push_back(&local_b0,(Int)uVar13,1.0);
      }
      SparseMatrix::add_column(&local_b0);
      uVar13 = uVar13 + 1;
    } while (uVar13 != (nrow & 0x7fffffff));
  }
  if (local_d8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_d8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  if (permuted_row.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(permuted_row.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  dVar6 = Onenorm(&local_b0);
  dVar7 = Infnorm(&local_b0);
  pdVar11 = rhs._M_data;
  sVar10 = rhs._M_size;
  pdVar9 = lhs._M_data;
  if (lhs._M_size != 0) {
    memset(lhs._M_data,0,lhs._M_size << 3);
  }
  if (0 < (int)(uint)sVar10) {
    piVar2 = (L->colptr_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = (L->rowidx_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (L->values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar13 = 0;
    do {
      dVar23 = *(double *)(&DAT_003be0c0 + (ulong)(0.0 <= pdVar9[uVar13]) * 8);
      pdVar11[uVar13] = dVar23;
      dVar23 = dVar23 + pdVar9[uVar13];
      pdVar9[uVar13] = dVar23;
      iVar1 = piVar2[uVar13];
      lVar15 = (long)iVar1;
      iVar16 = piVar2[uVar13 + 1];
      if (iVar1 < iVar16) {
        do {
          iVar1 = piVar3[lVar15];
          pdVar9[iVar1] = pdVar5[lVar15] * -dVar23 + pdVar9[iVar1];
          lVar15 = lVar15 + 1;
        } while (iVar16 != lVar15);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != ((uint)sVar10 & 0x7fffffff));
  }
  TriangularSolve(U,&lhs,'n',"upper",0);
  dVar23 = Onenorm(&lhs);
  MultiplyAdd(&local_b0,&lhs,-1.0,&rhs,'N');
  dVar8 = Onenorm(&rhs);
  pdVar11 = rhs._M_data;
  sVar10 = rhs._M_size;
  pdVar9 = lhs._M_data;
  if (lhs._M_size != 0) {
    memset(lhs._M_data,0,lhs._M_size << 3);
  }
  if (0 < (int)(uint)sVar10) {
    piVar2 = (U->colptr_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = (U->rowidx_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (U->values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar13 = 0;
    do {
      iVar1 = piVar2[uVar13];
      lVar15 = (long)iVar1;
      iVar16 = piVar2[uVar13 + 1];
      dVar19 = 0.0;
      dVar20 = 0.0;
      if (iVar1 < iVar16) {
        do {
          dVar19 = dVar19 + pdVar9[piVar3[lVar15]] * pdVar5[lVar15];
          lVar15 = lVar15 + 1;
          dVar20 = dVar19;
        } while (iVar16 != lVar15);
      }
      dVar19 = pdVar9[uVar13];
      pdVar9[uVar13] = dVar19 - dVar20;
      dVar20 = *(double *)(&DAT_003be0c0 + (ulong)(0.0 <= dVar19 - dVar20) * 8);
      pdVar11[uVar13] = dVar20;
      dVar20 = dVar20 + pdVar9[uVar13];
      pdVar9[uVar13] = dVar20;
      pdVar9[uVar13] = dVar20 / pdVar5[(long)iVar16 + -1];
      uVar13 = uVar13 + 1;
    } while (uVar13 != ((uint)sVar10 & 0x7fffffff));
  }
  TriangularSolve(L,&lhs,'t',"lower",1);
  dVar20 = Onenorm(&lhs);
  MultiplyAdd(&local_b0,&lhs,-1.0,&rhs,'T');
  dVar19 = Onenorm(&rhs);
  if (local_b0.values_queue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.values_queue_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b0.rowidx_queue_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.rowidx_queue_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_b0.values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_b0.rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_b0.rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_b0.colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_b0.colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  dVar7 = (double)iVar12 + dVar20 * dVar7;
  auVar21._8_8_ = dVar19;
  auVar21._0_8_ = dVar8;
  auVar22._8_4_ = SUB84(dVar7,0);
  auVar22._0_8_ = (double)iVar12 + dVar23 * dVar6;
  auVar22._12_4_ = (int)((ulong)dVar7 >> 0x20);
  auVar22 = divpd(auVar21,auVar22);
  uVar17 = auVar22._8_4_;
  uVar18 = auVar22._12_4_;
  if (auVar22._8_8_ <= auVar22._0_8_) {
    uVar17 = auVar22._0_4_;
    uVar18 = auVar22._4_4_;
  }
  local_168 = (double)CONCAT44(uVar18,uVar17);
  operator_delete(lhs._M_data);
  operator_delete(rhs._M_data);
  this->stability_ = local_168;
  return;
}

Assistant:

void LuFactorization::Factorize(Int dim, const Int* Bbegin, const Int* Bend,
                                const Int* Bi, const double* Bx,
                                double pivottol, bool strict_abs_pivottol,
                                SparseMatrix* L, SparseMatrix* U,
                                std::vector<Int>* rowperm,
                                std::vector<Int>* colperm,
                                std::vector<Int>* dependent_cols) {
    _Factorize(dim, Bbegin, Bend, Bi, Bx, pivottol, strict_abs_pivottol,
               L, U, rowperm, colperm, dependent_cols);
    stability_ = StabilityEstimate(Bbegin, Bend, Bi, Bx, *L, *U, *rowperm,
                                   *colperm, *dependent_cols);
}